

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O1

void __thiscall libchars::edit_object::set(edit_object *this,char *line,size_t idx)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  
  if (line == (char *)0x0) {
    this->insert_idx = 0;
    lVar3 = 0x28;
  }
  else {
    sVar1 = this->buflen;
    strncpy(this->buffer,line,0x3fff);
    this->buffer[0x3fff] = '\0';
    sVar2 = strlen(this->buffer);
    this->buflen = sVar2;
    if (sVar2 < idx) {
      idx = sVar2;
    }
    this->insert_idx = idx;
    lVar3 = 0x10;
    if (sVar1 == 0 || sVar2 != 0) {
      return;
    }
  }
  (**(code **)((long)this->_vptr_edit_object + lVar3))(this);
  return;
}

Assistant:

virtual void set(const char *line, size_t idx = std::string::npos)
        {
            if (line != NULL) {
                size_t L = buflen;
                strncpy(buffer,line,sizeof(buffer)-1);
                buffer[sizeof(buffer) - 1] = 0;
                buflen = strlen(buffer);

                if (idx <= buflen)
                    insert_idx = idx;
                else
                    insert_idx = buflen;

                if (L > 0 && buflen == 0)
                    emptied();
            }
            else {
                insert_idx = 0;
                wipe();
            }
        }